

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O3

Vector3 * __thiscall
stateObservation::kine::Orientation::differentiate
          (Vector3 *__return_storage_ptr__,Orientation *this,Orientation *R_k1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  char *pcVar7;
  ActualDstType actualDst;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  AngleAxis aa;
  undefined1 local_198 [40];
  undefined8 uStack_170;
  double local_168;
  double dStack_160;
  undefined **local_158;
  IsSet local_150;
  AssertMsg local_148;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  AngleAxis<double> local_e8;
  undefined1 local_c8 [64];
  undefined **local_88;
  IsSet local_80;
  AssertMsg local_78;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_68 [88];
  
  if ((this->q_).isSet_.b_ == false) {
    if ((this->m_).isSet_.b_ == false) goto LAB_001175cd;
    if ((this->m_).assertMsg_.b_ != (char *)0x0) {
      local_130 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[3];
      local_128 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[6];
      local_138 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[0];
      local_120 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[1];
      local_118 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[4];
      local_110 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[7];
      local_108 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[2];
      local_100 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[5];
      local_f8 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[8];
      local_198[8] = false;
      local_150.b_ = true;
      goto LAB_001174a9;
    }
LAB_00117597:
    pcVar7 = 
    "bool stateObservation::CheckedItem<Eigen::Matrix<double, 3, 3>, false, false, true, true>::chckitm_check_() const [T = Eigen::Matrix<double, 3, 3>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
    ;
  }
  else {
    pcVar7 = (this->q_).assertMsg_.b_;
    if ((this->m_).isSet_.b_ == true) {
      if (pcVar7 != (char *)0x0) {
        dVar3 = (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[0];
        dVar4 = *(double *)
                 ((long)(this->q_).v_.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array + 8);
        dVar5 = *(double *)
                 ((long)(this->q_).v_.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array + 0x10);
        dVar6 = *(double *)
                 ((long)(this->q_).v_.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array + 0x18);
        dVar15 = dVar6 * dVar6 + dVar4 * dVar4 + dVar5 * dVar5 + dVar3 * dVar3;
        auVar9 = ZEXT816(0);
        dVar13 = 0.0;
        dVar14 = 0.0;
        if (0.0 < dVar15) {
          auVar8._0_8_ = -dVar3;
          auVar8._8_8_ = -dVar4;
          auVar11._0_8_ = -dVar5;
          auVar11._8_8_ = dVar6;
          auVar1._8_8_ = dVar15;
          auVar1._0_8_ = dVar15;
          auVar9 = divpd(auVar8,auVar1);
          auVar2._8_8_ = dVar15;
          auVar2._0_8_ = dVar15;
          auVar12 = divpd(auVar11,auVar2);
          dVar13 = auVar12._0_8_;
          dVar14 = auVar12._8_8_;
        }
        if ((this->m_).assertMsg_.b_ == (char *)0x0) goto LAB_00117597;
        local_130 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[3];
        local_128 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[6];
        local_138 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[0];
        local_120 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[1];
        local_118 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[4];
        local_110 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[7];
        local_108 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[2];
        local_100 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[5];
        local_f8 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[8];
        local_198[8] = true;
        local_150.b_ = true;
        unique0x10000e93 = auVar9;
        local_168 = dVar13;
        dStack_160 = dVar14;
LAB_001174a9:
        local_158 = &PTR__CheckedItem_00121d08;
        local_198._0_8_ = &PTR__CheckedItem_00121cd8;
        local_198._16_8_ =
             detail::DebugItemDefaultError<(stateObservation::detail::errorType)0,0>::v;
        local_c8._0_8_ = &PTR__CheckedItem_00121cd8;
        local_c8[8] = true;
        local_c8._16_8_ = detail::DebugItemDefaultError<(stateObservation::detail::errorType)0,0>::v
        ;
        local_88 = &PTR__CheckedItem_00121d08;
        local_80.b_ = true;
        local_78.b_ = detail::DebugItemDefaultError<(stateObservation::detail::errorType)0,0>::v;
        local_148.b_ = (char *)local_198._16_8_;
        setToProductNoAlias((Orientation *)local_c8,R_k1,(Orientation *)local_198);
        if (local_c8[8] == false) {
          if (local_80.b_ == false) {
LAB_001175cd:
            __assert_fail("(isQuaternionSet() || isMatrixSet()) && \"The orientation is not initialized\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                          ,0x3ef,"void stateObservation::kine::Orientation::check_() const");
          }
          if (local_78.b_ != (char *)0x0) {
            Eigen::AngleAxis<double>::operator=(&local_e8,local_68);
            local_e8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[2] =
                 local_e8.m_angle *
                 local_e8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[2];
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[0] =
                 local_e8.m_angle *
                 local_e8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0];
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[1] =
                 local_e8.m_angle *
                 local_e8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[1];
            goto LAB_00117584;
          }
          goto LAB_00117597;
        }
        if ((char *)local_c8._16_8_ != (char *)0x0) {
          Eigen::AngleAxis<double>::operator=
                    (&local_e8,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)(local_c8 + 0x20));
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[0] =
               local_e8.m_angle *
               local_e8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0];
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1] =
               local_e8.m_angle *
               local_e8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[1];
          local_e8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2] =
               local_e8.m_angle *
               local_e8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2];
LAB_00117584:
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2] =
               local_e8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2];
          return __return_storage_ptr__;
        }
      }
    }
    else if (pcVar7 != (char *)0x0) {
      dVar3 = (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0];
      dVar4 = *(double *)
               ((long)(this->q_).v_.m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array + 8);
      dVar5 = *(double *)
               ((long)(this->q_).v_.m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array + 0x10);
      dVar6 = *(double *)
               ((long)(this->q_).v_.m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array + 0x18);
      auVar9._0_8_ = dVar6 * dVar6 + dVar4 * dVar4 + dVar5 * dVar5 + dVar3 * dVar3;
      local_168 = 0.0;
      dStack_160 = 0.0;
      local_198._32_8_ = 0;
      uStack_170 = 0;
      if (0.0 < auVar9._0_8_) {
        auVar12._0_8_ = -dVar3;
        auVar12._8_8_ = -dVar4;
        auVar10._0_8_ = -dVar5;
        auVar10._8_8_ = dVar6;
        auVar9._8_8_ = auVar9._0_8_;
        auVar12 = divpd(auVar12,auVar9);
        auVar9 = divpd(auVar10,auVar9);
        local_168 = auVar9._0_8_;
        dStack_160 = auVar9._8_8_;
        local_198._32_8_ = auVar12._0_8_;
        uStack_170 = auVar12._8_8_;
      }
      local_198[8] = true;
      local_150.b_ = false;
      goto LAB_001174a9;
    }
    pcVar7 = 
    "bool stateObservation::CheckedItem<Eigen::Quaternion<double>, false, false, true, true>::chckitm_check_() const [T = Eigen::Quaternion<double>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
    ;
  }
  __assert_fail("(isSet())&&(assertMsg_.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x69,pcVar7);
}

Assistant:

inline Vector3 Orientation::differentiate(Orientation R_k1) const
{
  check_();
  return (Orientation(R_k1, inverse())).toRotationVector();
}